

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O3

string * __thiscall
CodeGenerator::generate_java_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 "// Generated by program-homework-solver \n\nclass test{\n\n\tpublic int f(int x){\n\t\tint answer = "
                 ,&this->func);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_java_code() {
    string code =
            "// Generated by program-homework-solver \n\n"
            "class test{\n\n"
            "\tpublic int f(int x){\n"
            "\t\tint answer = " + CodeGenerator::func +";\n"
            "\t\treturn answer;\n"
            "}\n\n"
            "\tpublic static void main(String args[]){\n"
            "\t\ttest t = new test();\n"
            "\t\tfor(int i=0; i<20; i++){\n"
            "\t\t\tSystem.out.println(t.f(i));\n"
            "\t\t}\n"
            "\n\t}"
            "\n}";

    return code;
}